

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O3

void __thiscall Omega_h::Read<int>::Read(Read<signed_char> *this,Write<int> *write)

{
  Alloc *pAVar1;
  
  pAVar1 = (write->shared_alloc_).alloc;
  (this->write_).shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->write_).shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->write_).shared_alloc_.direct_ptr = (write->shared_alloc_).direct_ptr;
  return;
}

Assistant:

OMEGA_H_INLINE void copy(SharedAlloc const& other) noexcept {
    alloc = other.alloc;
#ifndef __CUDA_ARCH__
    if (alloc && (!(reinterpret_cast<std::uintptr_t>(alloc) & FREE_MASK))) {
      // allocated
      if (entering_parallel) {
        alloc = reinterpret_cast<Alloc*>(
            (std::uintptr_t(alloc->size) << 3) | IN_PARALLEL);
      } else {
        ++(alloc->use_count);
      }
    }
#endif
    direct_ptr = other.direct_ptr;
  }